

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void mips_tr_translate_insn(DisasContextBase *dcbase,CPUState *cs)

{
  CPUArchState_conflict13 *env_00;
  uc_struct *uc_00;
  TCGContext_conflict6 *tcg_ctx_00;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  _Bool _Var5;
  int iVar6;
  uint32_t uVar7;
  uint local_60;
  int iStack_5c;
  _Bool hook_insn;
  int is_slot;
  int insn_bytes;
  TCGOp *prev_op;
  TCGOp *tcg_op;
  TCGContext_conflict6 *tcg_ctx;
  uc_struct_conflict7 *uc;
  DisasContextBase *__mptr;
  DisasContext_conflict6 *ctx;
  CPUMIPSState_conflict8 *env;
  CPUState *cs_local;
  DisasContextBase *dcbase_local;
  
  env_00 = (CPUArchState_conflict13 *)cs->env_ptr;
  uc_00 = (uc_struct *)cs->uc;
  tcg_ctx_00 = (TCGContext_conflict6 *)uc_00->tcg_ctx;
  _is_slot = (TCGOp *)0x0;
  bVar4 = false;
  local_60 = (uint)dcbase[2].pc_next & 0x87f800;
  iVar6 = uc_addr_is_exit(uc_00,dcbase->pc_next);
  if (iVar6 == 0) {
    _Var5 = _hook_exists_bounded(uc_00->hook[2].head,dcbase->pc_next);
    if (_Var5) {
      gen_save_pc(tcg_ctx_00,dcbase->pc_next);
      _is_slot = tcg_last_op(tcg_ctx_00);
      bVar4 = true;
      gen_uc_tracecode(tcg_ctx_00,4,2,uc_00,dcbase->pc_next);
      if (local_60 == 0) {
        check_exit_request_mips64el(tcg_ctx_00);
      }
    }
    uVar1._0_4_ = dcbase[1].is_jmp;
    uVar1._4_4_ = dcbase[1].num_insns;
    if ((uVar1 & 0x8000) == 0) {
      if ((dcbase[2].pc_next & 0x400) == 0) {
        uVar7 = cpu_ldl_code_mips64el(env_00,dcbase->pc_next);
        *(uint32_t *)&dcbase[1].pc_next = uVar7;
        iStack_5c = 4;
        decode_opc((CPUMIPSState_conflict8 *)env_00,(DisasContext_conflict6 *)dcbase);
      }
      else {
        uVar2._0_4_ = dcbase[1].is_jmp;
        uVar2._4_4_ = dcbase[1].num_insns;
        if ((uVar2 & 0x10000000000) == 0) {
          uVar3._0_4_ = dcbase[1].is_jmp;
          uVar3._4_4_ = dcbase[1].num_insns;
          if ((uVar3 & 0x100000000) == 0) {
            generate_exception_end((DisasContext_conflict6 *)dcbase,0x14);
            if (dcbase->is_jmp == DISAS_NORETURN) {
              return;
            }
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/translate.c"
                       ,0x78fe,"ctx->base.is_jmp == DISAS_NORETURN");
          }
          uVar7 = cpu_lduw_code_mips64el(env_00,dcbase->pc_next);
          *(uint32_t *)&dcbase[1].pc_next = uVar7;
          iStack_5c = decode_mips16_opc((CPUMIPSState_conflict8 *)env_00,
                                        (DisasContext_conflict6 *)dcbase);
        }
        else {
          uVar7 = cpu_lduw_code_mips64el(env_00,dcbase->pc_next);
          *(uint32_t *)&dcbase[1].pc_next = uVar7;
          iStack_5c = decode_micromips_opc
                                ((CPUMIPSState_conflict8 *)env_00,(DisasContext_conflict6 *)dcbase);
        }
      }
    }
    else {
      uVar7 = cpu_lduw_code_mips64el(env_00,dcbase->pc_next);
      *(uint32_t *)&dcbase[1].pc_next = uVar7;
      iStack_5c = decode_nanomips_opc((CPUMIPSState_conflict8 *)env_00,
                                      (DisasContext_conflict6 *)dcbase);
    }
    if (bVar4) {
      if (_is_slot == (TCGOp *)0x0) {
        prev_op = (tcg_ctx_00->ops).tqh_first;
      }
      else {
        prev_op = (_is_slot->link).tqe_next;
      }
      prev_op->args[1] = (long)iStack_5c;
    }
    if ((dcbase[2].pc_next & 0x87f800) != 0) {
      if ((dcbase[2].pc_next & 0x818000) == 0) {
        local_60 = 1;
      }
      if (((dcbase[2].pc_next & 0x400) != 0) && ((dcbase[2].pc_next & 0x800000) != 0)) {
        local_60 = 1;
      }
    }
    if (local_60 != 0) {
      gen_branch((DisasContext_conflict6 *)dcbase,iStack_5c);
    }
    dcbase->pc_next = (long)iStack_5c + dcbase->pc_next;
    if (dcbase->is_jmp == DISAS_NEXT) {
      if (((dcbase->singlestep_enabled & 1U) != 0) && ((dcbase[2].pc_next & 0x87f800) == 0)) {
        dcbase->is_jmp = DISAS_TOO_MANY;
      }
      if (0xfff < dcbase->pc_next - dcbase[1].pc_first) {
        dcbase->is_jmp = DISAS_TOO_MANY;
      }
    }
  }
  else {
    gen_helper_wait(tcg_ctx_00,tcg_ctx_00->cpu_env);
    dcbase->is_jmp = DISAS_NORETURN;
  }
  return;
}

Assistant:

static void mips_tr_translate_insn(DisasContextBase *dcbase, CPUState *cs)
{
    CPUMIPSState *env = cs->env_ptr;
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = cs->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    TCGOp *tcg_op, *prev_op = NULL;
    int insn_bytes;
    int is_slot;
    bool hook_insn = false;

    is_slot = ctx->hflags & MIPS_HFLAG_BMASK;

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, ctx->base.pc_next)) {
        // raise a special interrupt to quit
        gen_helper_wait(tcg_ctx, tcg_ctx->cpu_env);
        ctx->base.is_jmp = DISAS_NORETURN;
        return;
    }

    // Unicorn: trace this instruction on request
    if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_CODE, ctx->base.pc_next)) {

        // Sync PC in advance
        gen_save_pc(tcg_ctx, ctx->base.pc_next);

        // save the last operand
        prev_op = tcg_last_op(tcg_ctx);
        hook_insn = true;
        gen_uc_tracecode(tcg_ctx, 4, UC_HOOK_CODE_IDX, uc, ctx->base.pc_next);
        // Don't let unicorn stop at the branch delay slot.
        if (!is_slot) {
            // the callback might want to stop emulation immediately
            check_exit_request(tcg_ctx);
        }
    }
    
    if (ctx->insn_flags & ISA_NANOMIPS32) {
        ctx->opcode = cpu_lduw_code(env, ctx->base.pc_next);
        insn_bytes = decode_nanomips_opc(env, ctx);
    } else if (!(ctx->hflags & MIPS_HFLAG_M16)) {
        ctx->opcode = cpu_ldl_code(env, ctx->base.pc_next);
        insn_bytes = 4;
        decode_opc(env, ctx);
    } else if (ctx->insn_flags & ASE_MICROMIPS) {
        ctx->opcode = cpu_lduw_code(env, ctx->base.pc_next);
        insn_bytes = decode_micromips_opc(env, ctx);
    } else if (ctx->insn_flags & ASE_MIPS16) {
        ctx->opcode = cpu_lduw_code(env, ctx->base.pc_next);
        insn_bytes = decode_mips16_opc(env, ctx);
    } else {
        generate_exception_end(ctx, EXCP_RI);
        g_assert(ctx->base.is_jmp == DISAS_NORETURN);
        return;
    }

    if (hook_insn) {
        // Unicorn: patch the callback to have the proper instruction size.
        if (prev_op) {
            // As explained further up in the function where prev_op is
            // assigned, we move forward in the tail queue, so we're modifying the
            // move instruction generated by gen_uc_tracecode() that contains
            // the instruction size to assign the proper size (replacing 0xF1F1F1F1).
            tcg_op = QTAILQ_NEXT(prev_op, link);
        } else {
            // this instruction is the first emulated code ever,
            // so the instruction operand is the first operand
            tcg_op = QTAILQ_FIRST(&tcg_ctx->ops);
        }

        tcg_op->args[1] = insn_bytes;
    }

    if (ctx->hflags & MIPS_HFLAG_BMASK) {
        if (!(ctx->hflags & (MIPS_HFLAG_BDS16 | MIPS_HFLAG_BDS32 |
                             MIPS_HFLAG_FBNSLOT))) {
            /*
             * Force to generate branch as there is neither delay nor
             * forbidden slot.
             */
            is_slot = 1;
        }
        if ((ctx->hflags & MIPS_HFLAG_M16) &&
            (ctx->hflags & MIPS_HFLAG_FBNSLOT)) {
            /*
             * Force to generate branch as microMIPS R6 doesn't restrict
             * branches in the forbidden slot.
             */
            is_slot = 1;
        }
    }
    if (is_slot) {
        gen_branch(ctx, insn_bytes);
    }
    ctx->base.pc_next += insn_bytes;

    if (ctx->base.is_jmp != DISAS_NEXT) {
        return;
    }
    /*
     * Execute a branch and its delay slot as a single instruction.
     * This is what GDB expects and is consistent with what the
     * hardware does (e.g. if a delay slot instruction faults, the
     * reported PC is the PC of the branch).
     */
    if (ctx->base.singlestep_enabled &&
        (ctx->hflags & MIPS_HFLAG_BMASK) == 0) {
        ctx->base.is_jmp = DISAS_TOO_MANY;
    }
    if (ctx->base.pc_next - ctx->page_start >= TARGET_PAGE_SIZE) {
        ctx->base.is_jmp = DISAS_TOO_MANY;
    }
}